

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CERunningDate.cpp
# Opt level: O0

bool __thiscall test_CERunningDate::test_timer_manip(test_CERunningDate *this)

{
  byte bVar1;
  double *in_RDI;
  double new_speed;
  CERunningDate test1;
  CERunningDate *in_stack_fffffffffffffeb0;
  CERunningDate *pCVar2;
  CERunningDate *in_stack_fffffffffffffeb8;
  CERunningDate *in_stack_fffffffffffffec0;
  allocator *paVar3;
  undefined1 local_109;
  int local_108 [8];
  double local_e8;
  double local_e0;
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [32];
  double local_b0;
  double local_a8;
  undefined4 local_a0;
  allocator local_99;
  string local_98 [32];
  undefined8 local_78 [3];
  double local_60;
  CERunningDate local_58;
  
  pCVar2 = &local_58;
  CERunningDate::CERunningDate(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_60 = CERunningDate::GetTimerSpeed(pCVar2);
  local_78[0] = 0x3ff0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"test_timer_manip",&local_99);
  local_a0 = 0x69;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,&local_60,local_78,local_98,&local_a0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_a8 = 100.0;
  CERunningDate::SetTimerSpeed(&local_58,&local_a8);
  local_b0 = CERunningDate::GetTimerSpeed(&local_58);
  paVar3 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"test_timer_manip",paVar3);
  local_d8 = 0x6c;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,&local_b0,&local_a8,local_d0,&local_d8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  CERunningDate::ResetTime(in_stack_fffffffffffffeb0);
  CERunningDate::SetTimerSpeed(&local_58,&local_a8);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)pCVar2);
  local_e0 = CERunningDate::ScaledRunTime(in_stack_fffffffffffffeb0);
  local_e8 = ((double)(long)in_RDI[0x56] + (double)(long)in_RDI[0x56]) / 1000.0;
  pCVar2 = (CERunningDate *)&local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_108,"test_timer_manip",(allocator *)pCVar2);
  CETestSuite::test_greaterthan(in_RDI,&local_e0,(string *)&local_e8,local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  bVar1 = (**(code **)((long)*in_RDI + 0x18))();
  CERunningDate::~CERunningDate(pCVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CERunningDate::test_timer_manip(void)
{
    // Get a copy of the base timer
    CERunningDate test1(base_);
    
    // Test updating the timer speed
    test_double(test1.GetTimerSpeed(), 1.0, __func__, __LINE__);
    double new_speed(100.0);
    test1.SetTimerSpeed(new_speed);
    test_double(test1.GetTimerSpeed(), new_speed, __func__, __LINE__);
    
    // Pause for some amount of time and test that the 
    test1.ResetTime();
    test1.SetTimerSpeed(new_speed);
    std::this_thread::sleep_for(naptime_);
    test_greaterthan(test1.ScaledRunTime(), naptime_ms_*2.0/1000.0, __func__, __LINE__);

    // Reset the timer
    return pass();
}